

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O2

EStatusCode __thiscall
Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary(Type1ToCFFEmbeddedFontWriter *this)

{
  OutputStringBufferStream *this_00;
  CFFPrimitiveWriter *inWriter;
  EStatusCode EVar1;
  LongFilePositionType LVar2;
  Type1ToCFFEmbeddedFontWriter *pTVar3;
  
  this_00 = &this->mFontFileStream;
  pTVar3 = (Type1ToCFFEmbeddedFontWriter *)this_00;
  LVar2 = OutputStringBufferStream::GetCurrentPosition(this_00);
  this->mPrivatePosition = LVar2;
  inWriter = &this->mPrimitivesWriter;
  AddDeltaVectorIfNotEmpty(pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.BlueValues,6);
  AddDeltaVectorIfNotEmpty(pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.OtherBlues,7);
  AddDeltaVectorIfNotEmpty(pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.FamilyBlues,8);
  AddDeltaVectorIfNotEmpty
            (pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.FamilyOtherBlues,9);
  AddNumberOperandIfNotDefault
            (pTVar3,inWriter,(this->mType1Input).mPrivateDictionary.BlueScale,0xc09,0.039625);
  AddNumberOperandIfNotDefault
            (pTVar3,inWriter,(this->mType1Input).mPrivateDictionary.BlueShift,0xc0a,7);
  AddNumberOperandIfNotDefault
            (pTVar3,inWriter,(this->mType1Input).mPrivateDictionary.BlueFuzz,0xc0b,1);
  CFFPrimitiveWriter::WriteRealOperand(inWriter,(this->mType1Input).mPrivateDictionary.StdHW,10);
  CFFPrimitiveWriter::WriteDictOperator(inWriter,10);
  CFFPrimitiveWriter::WriteRealOperand(inWriter,(this->mType1Input).mPrivateDictionary.StdVW,10);
  pTVar3 = (Type1ToCFFEmbeddedFontWriter *)inWriter;
  CFFPrimitiveWriter::WriteDictOperator(inWriter,0xb);
  AddDeltaVectorIfNotEmpty(pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.StemSnapH,0xc0c);
  AddDeltaVectorIfNotEmpty(pTVar3,inWriter,&(this->mType1Input).mPrivateDictionary.StemSnapV,0xc0d);
  AddNumberOperandIfNotDefault
            (pTVar3,inWriter,(uint)(this->mType1Input).mPrivateDictionary.ForceBold,0xc0e,0);
  AddNumberOperandIfNotDefault
            (pTVar3,inWriter,(this->mType1Input).mPrivateDictionary.LanguageGroup,0xc11,0);
  LVar2 = OutputStringBufferStream::GetCurrentPosition(this_00);
  this->mPrivateSize = LVar2 - this->mPrivatePosition;
  EVar1 = CFFPrimitiveWriter::GetInternalState(inWriter);
  return EVar1;
}

Assistant:

EStatusCode Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary()
{
	mPrivatePosition = mFontFileStream.GetCurrentPosition();

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueValues,6);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.OtherBlues,7);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyBlues,8);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyOtherBlues,9);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueScale,0xC09,0.039625);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueShift,0xC0A,7);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueFuzz,0xC0B,1);
	
	// StdHW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdHW);
	mPrimitivesWriter.WriteDictOperator(0xA);

	// StdVW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdVW);
	mPrimitivesWriter.WriteDictOperator(0xB);

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapH,0xC0C);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapV,0xC0D);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,(int)(mType1Input.mPrivateDictionary.ForceBold ? 1:0),0xC0E,0);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.LanguageGroup,0xC11,0);

	mPrivateSize = mFontFileStream.GetCurrentPosition() - mPrivatePosition;
	return mPrimitivesWriter.GetInternalState();
}